

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Wire.cpp
# Opt level: O1

void __thiscall CWire::Enumerate(CWire *this,int iMode)

{
  CDesign *this_00;
  uint uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  CLayer *pCVar9;
  int iVar10;
  uint uVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  CPoint MidPoint;
  CPoint MidPoint2;
  vector<CSegment_*,_std::allocator<CSegment_*>_> local_a8;
  vector<CSegment_*,_std::allocator<CSegment_*>_> local_90;
  vector<CSegment_*,_std::allocator<CSegment_*>_> local_78;
  vector<CSegment_*,_std::allocator<CSegment_*>_> local_60;
  vector<CSegment_*,_std::allocator<CSegment_*>_> local_48;
  
  this_00 = CObject::m_pDesign;
  uVar1 = (this->super_CObject).m_iProp;
  uVar11 = 10;
  if ((uVar1 & 10) == 0) {
    uVar11 = uVar1 & 0x10;
  }
  uVar13 = 5;
  if ((uVar1 & 5) == 0) {
    uVar13 = uVar11;
  }
  if ((uVar1 >> 9 & 1) == 0) {
    iVar12 = (int)(CObject::m_pDesign->super_CBBox).m_cMaxZ;
    iVar10 = (int)(CObject::m_pDesign->super_CBBox).m_cMinZ;
    iVar15 = iVar12 - iVar10;
    if ((uVar1 & 0xf) == 0) {
      if ((iMode & 1U) != 0) {
        CPoint::CPoint(&MidPoint);
        CPoint::Initialize(&MidPoint,(int)this->m_pPointS->m_iX,(int)this->m_pPointE->m_iY,
                           (int)this->m_pPointS->m_cZ,(CWire *)0x0);
        iVar2 = CPoint::GetDirection(this->m_pPointS,&MidPoint);
        CPoint::SetZ(&MidPoint,(int)this->m_pPointE->m_cZ);
        iVar3 = CPoint::GetDirection(&MidPoint,this->m_pPointE);
        if (0 < iVar15) {
          iVar16 = 1;
          do {
            pCVar9 = CDesign::GetLayer(this_00,iVar16);
            iVar4 = CLayer::GetDirection(pCVar9);
            if (iVar4 == iVar2) {
              iVar4 = 1;
              do {
                pCVar9 = CDesign::GetLayer(this_00,iVar4);
                iVar5 = CLayer::GetDirection(pCVar9);
                if (iVar5 == iVar3) {
                  Bend(&local_60,this,(int)MidPoint.m_iX,(int)MidPoint.m_iY,iVar16,iVar4);
                  std::
                  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                  ::push_back(&this->m_SegmentList,&local_60);
                  if (local_60.super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_60.
                                    super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_60.
                                          super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_60.
                                          super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                iVar5 = (iVar10 - iVar12) + iVar4;
                iVar4 = iVar4 + 1;
              } while (iVar5 != 0);
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 != iVar15 + 1);
        }
        CPoint::Initialize(&MidPoint,(int)this->m_pPointE->m_iX,(int)this->m_pPointS->m_iY,
                           (int)this->m_pPointS->m_cZ,(CWire *)0x0);
        iVar2 = CPoint::GetDirection(this->m_pPointS,&MidPoint);
        CPoint::SetZ(&MidPoint,(int)this->m_pPointE->m_cZ);
        iVar3 = CPoint::GetDirection(&MidPoint,this->m_pPointE);
        if (0 < iVar15) {
          iVar16 = 1;
          do {
            pCVar9 = CDesign::GetLayer(this_00,iVar16);
            iVar4 = CLayer::GetDirection(pCVar9);
            if (iVar4 == iVar2) {
              iVar4 = 1;
              do {
                pCVar9 = CDesign::GetLayer(this_00,iVar4);
                iVar5 = CLayer::GetDirection(pCVar9);
                if (iVar5 == iVar3) {
                  Bend(&local_78,this,(int)MidPoint.m_iX,(int)MidPoint.m_iY,iVar16,iVar4);
                  std::
                  vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                  ::push_back(&this->m_SegmentList,&local_78);
                  if (local_78.super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>._M_impl.
                      super__Vector_impl_data._M_start != (pointer)0x0) {
                    operator_delete(local_78.
                                    super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>.
                                    _M_impl.super__Vector_impl_data._M_start,
                                    (long)local_78.
                                          super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                    (long)local_78.
                                          super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                          ._M_impl.super__Vector_impl_data._M_start);
                  }
                }
                iVar5 = (iVar10 - iVar12) + iVar4;
                iVar4 = iVar4 + 1;
              } while (iVar5 != 0);
            }
            iVar16 = iVar16 + 1;
          } while (iVar16 != iVar15 + 1);
        }
        CPoint::~CPoint(&MidPoint);
      }
      if ((iMode & 2U) != 0) {
        CPoint::CPoint(&MidPoint);
        CPoint::CPoint(&MidPoint2);
        iVar2 = (int)this->m_pPointE->m_iX;
        iVar3 = this->m_pPointS->m_iX + 1;
        if (iVar3 < iVar2) {
          do {
            CPoint::Initialize(&MidPoint,iVar3,(int)this->m_pPointS->m_iY,(int)this->m_pPointS->m_cZ
                               ,(CWire *)0x0);
            CPoint::Initialize(&MidPoint2,iVar3,(int)this->m_pPointE->m_iY,
                               (int)this->m_pPointS->m_cZ,(CWire *)0x0);
            iVar16 = CPoint::GetDirection(this->m_pPointS,&MidPoint);
            iVar4 = CPoint::GetDirection(&MidPoint,&MidPoint2);
            CPoint::SetZ(&MidPoint2,(int)this->m_pPointE->m_cZ);
            iVar5 = CPoint::GetDirection(&MidPoint2,this->m_pPointE);
            if (0 < iVar15) {
              iVar14 = 1;
              do {
                pCVar9 = CDesign::GetLayer(this_00,iVar14);
                iVar6 = CLayer::GetDirection(pCVar9);
                if (iVar6 == iVar16) {
                  iVar6 = 1;
                  do {
                    pCVar9 = CDesign::GetLayer(this_00,iVar6);
                    iVar7 = CLayer::GetDirection(pCVar9);
                    if (iVar7 == iVar4) {
                      iVar7 = 1;
                      do {
                        pCVar9 = CDesign::GetLayer(this_00,iVar7);
                        iVar8 = CLayer::GetDirection(pCVar9);
                        if (iVar8 == iVar5) {
                          Bend(&local_a8,this,(int)MidPoint.m_iX,(int)MidPoint.m_iY,
                               (int)MidPoint2.m_iX,(int)MidPoint2.m_iY,iVar14,iVar6,iVar7);
                          std::
                          vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                          ::push_back(&this->m_SegmentList,&local_a8);
                          if (local_a8.super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_a8.
                                            super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_a8.
                                                  super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_a8.
                                                  super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                        }
                        iVar8 = (iVar10 - iVar12) + iVar7;
                        iVar7 = iVar7 + 1;
                      } while (iVar8 != 0);
                    }
                    iVar6 = iVar6 + 1;
                  } while (iVar6 != iVar15 + 1);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 != iVar15 + 1);
            }
            iVar3 = iVar3 + 1;
          } while (iVar3 != iVar2);
        }
        iVar16 = (int)this->m_pPointS->m_iY;
        iVar3 = (int)this->m_pPointE->m_iY;
        iVar2 = iVar3;
        if (iVar16 < iVar3) {
          iVar2 = iVar16;
        }
        if (iVar3 < iVar16) {
          iVar3 = iVar16;
        }
        iVar2 = iVar2 + 1;
        if (iVar2 < iVar3) {
          do {
            CPoint::Initialize(&MidPoint,(int)this->m_pPointS->m_iX,iVar2,(int)this->m_pPointS->m_cZ
                               ,(CWire *)0x0);
            CPoint::Initialize(&MidPoint2,(int)this->m_pPointE->m_iX,iVar2,
                               (int)this->m_pPointS->m_cZ,(CWire *)0x0);
            iVar16 = CPoint::GetDirection(this->m_pPointS,&MidPoint);
            iVar4 = CPoint::GetDirection(&MidPoint,&MidPoint2);
            CPoint::SetZ(&MidPoint2,(int)this->m_pPointE->m_cZ);
            iVar5 = CPoint::GetDirection(&MidPoint2,this->m_pPointE);
            if (0 < iVar15) {
              iVar14 = 1;
              do {
                pCVar9 = CDesign::GetLayer(this_00,iVar14);
                iVar6 = CLayer::GetDirection(pCVar9);
                if (iVar6 == iVar16) {
                  iVar6 = 1;
                  do {
                    pCVar9 = CDesign::GetLayer(this_00,iVar6);
                    iVar7 = CLayer::GetDirection(pCVar9);
                    if (iVar7 == iVar4) {
                      iVar7 = 1;
                      do {
                        pCVar9 = CDesign::GetLayer(this_00,iVar7);
                        iVar8 = CLayer::GetDirection(pCVar9);
                        if (iVar8 == iVar5) {
                          Bend(&local_90,this,(int)MidPoint.m_iX,(int)MidPoint.m_iY,
                               (int)MidPoint2.m_iX,(int)MidPoint2.m_iY,iVar14,iVar6,iVar7);
                          std::
                          vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
                          ::push_back(&this->m_SegmentList,&local_90);
                          if (local_90.super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>.
                              _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
                            operator_delete(local_90.
                                            super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                            ._M_impl.super__Vector_impl_data._M_start,
                                            (long)local_90.
                                                  super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_end_of_storage
                                            - (long)local_90.
                                                  super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start);
                          }
                        }
                        iVar8 = (iVar10 - iVar12) + iVar7;
                        iVar7 = iVar7 + 1;
                      } while (iVar8 != 0);
                    }
                    iVar6 = iVar6 + 1;
                  } while (iVar6 != iVar15 + 1);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 != iVar15 + 1);
            }
            iVar2 = iVar2 + 1;
          } while (iVar2 != iVar3);
        }
        CPoint::~CPoint(&MidPoint2);
        CPoint::~CPoint(&MidPoint);
      }
    }
    else if (0 < iVar15) {
      iVar15 = 1;
      do {
        pCVar9 = CDesign::GetLayer(this_00,iVar15);
        uVar1 = CLayer::GetDirection(pCVar9);
        if (uVar1 == uVar13) {
          Bend(&local_48,this,iVar15);
          std::
          vector<std::vector<CSegment_*,_std::allocator<CSegment_*>_>,_std::allocator<std::vector<CSegment_*,_std::allocator<CSegment_*>_>_>_>
          ::push_back(&this->m_SegmentList,&local_48);
          if (local_48.super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_48.super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_48.
                                  super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_48.
                                  super__Vector_base<CSegment_*,_std::allocator<CSegment_*>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
        }
        iVar2 = (iVar10 - iVar12) + iVar15;
        iVar15 = iVar15 + 1;
      } while (iVar2 != 0);
    }
  }
  return;
}

Assistant:

void CWire::Enumerate(int iMode)
{
	CDesign*	pDesign		=	GetDesign();
	int			iNumLayer	=	pDesign->T();
	int			iDirection	=	GetDirection();
	int			i,j,k;

	if(IsPoint())
	{
		
	}
	else if(IsFlat())
	{
		for (i=1;i<=iNumLayer;++i)
		{
			if(pDesign->GetLayer(i)->GetDirection()==iDirection)
			{	
				AddSegmentList(Bend(i));
			}
		}
	}
	else
	{
		//////////////////////////////////////////////////////////////////////////
		// L-shape routing [6/19/2006 thyeros]
		//////////////////////////////////////////////////////////////////////////
		if(iMode&ENUM_MODE_L)
		{
			int	i1stElbowDir	=	DIR_DIAGONAL;
			int	i2ndElbowDir	=	DIR_DIAGONAL;
			
			CPoint	MidPoint;
			
			MidPoint.Initialize(m_pPointS->X(),m_pPointE->Y(),m_pPointS->Z(),NULL);			
			i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint);
			MidPoint.SetZ(m_pPointE->Z());
			i2ndElbowDir	=	MidPoint.GetDirection(m_pPointE);
			
			for (i=LAYER_METAL1;i<=iNumLayer;++i)
			{
				if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
				{				
					for (j=LAYER_METAL1;j<=iNumLayer;++j)
					{
						if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
						{
							AddSegmentList(Bend(&MidPoint,i,j));	
						}
					}
				}
			}
			
			MidPoint.Initialize(m_pPointE->X(),m_pPointS->Y(),m_pPointS->Z(),NULL);
			i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint);
			MidPoint.SetZ(m_pPointE->Z());
			i2ndElbowDir	=	MidPoint.GetDirection(m_pPointE);
			
			for (i=LAYER_METAL1;i<=iNumLayer;++i)
			{
				if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
				{				
					for (j=LAYER_METAL1;j<=iNumLayer;++j)
					{
						if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
						{
							AddSegmentList(Bend(&MidPoint,i,j));	
						}
					}
				}
			}

			//// minimum via enumeration [2/9/2007 thyeros]
			//for (i=LAYER_METAL1;i<=iNumLayer;++i)
			//{
			//	if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
			//	{				
			//		int	iLayerBelow	=	i-1;
			//		int	iLayerAbove	=	i+1;

			//		if(iLayerBelow>=LAYER_METAL1&&pDesign->GetLayer(iLayerBelow)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerBelow));	
			//		if(iLayerAbove<=iNumLayer&&pDesign->GetLayer(iLayerAbove)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerAbove));	
			//	}
			//}
			//
			//MidPoint.Initialize(m_pPointE->X(),m_pPointS->Y(),m_pPointS->Z(),NULL);
			//i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint);
			//MidPoint.SetZ(m_pPointE->Z());
			//i2ndElbowDir	=	MidPoint.GetDirection(m_pPointE);
			//
			//for (i=LAYER_METAL1;i<=iNumLayer;++i)
			//{
			//	if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
			//	{				
			//		int	iLayerBelow	=	i-1;
			//		int	iLayerAbove	=	i+1;

			//		if(iLayerBelow>=LAYER_METAL1&&pDesign->GetLayer(iLayerBelow)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerBelow));	
			//		if(iLayerAbove<=iNumLayer&&pDesign->GetLayer(iLayerAbove)->GetDirection()==i2ndElbowDir)	AddSegmentList(Bend(&MidPoint,i,iLayerAbove));	
			//	}
			//}
		}
		
		//////////////////////////////////////////////////////////////////////////
		// Z-shape routing [6/19/2006 thyeros]
		//////////////////////////////////////////////////////////////////////////
		if(iMode&ENUM_MODE_Z)
		{
			int	i1stElbowDir	=	DIR_DIAGONAL;
			int	i2ndElbowDir	=	DIR_DIAGONAL;
			int	i3rdElbowDir	=	DIR_DIAGONAL;
			
			CPoint	MidPoint1,MidPoint2;
			
			// slide X [9/6/2006 thyeros]
			int	iMinX	=	m_pPointS->X();
			int	iMaxX	=	m_pPointE->X();

			for (int iX=iMinX+1;iX<iMaxX;iX++)
			{
				MidPoint1.Initialize(iX,m_pPointS->Y(),m_pPointS->Z(),NULL);
				MidPoint2.Initialize(iX,m_pPointE->Y(),m_pPointS->Z(),NULL);
				
				i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint1);
				i2ndElbowDir	=	MidPoint1.GetDirection(&MidPoint2);
				MidPoint2.SetZ(m_pPointE->Z());
				i3rdElbowDir	=	MidPoint2.GetDirection(m_pPointE);

				for (i=LAYER_METAL1;i<=iNumLayer;++i)
				{
					if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
					{				
						for (j=LAYER_METAL1;j<=iNumLayer;++j)
						{
							if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
							{
								for (k=LAYER_METAL1;k<=iNumLayer;k++)
								{
									if(pDesign->GetLayer(k)->GetDirection()==i3rdElbowDir)
									{
										AddSegmentList(Bend(&MidPoint1,&MidPoint2,i,j,k));	
									}
								}
							}
						}
					}
				}
			}

			// slide Y [9/6/2006 thyeros]
			int	iMinY	=	MIN(m_pPointS->Y(),m_pPointE->Y());
			int	iMaxY	=	MAX(m_pPointS->Y(),m_pPointE->Y());

			for (int iY=iMinY+1;iY<iMaxY;iY++)
			{
				MidPoint1.Initialize(m_pPointS->X(),iY,m_pPointS->Z(),NULL);
				MidPoint2.Initialize(m_pPointE->X(),iY,m_pPointS->Z(),NULL);
				
				i1stElbowDir	=	m_pPointS->GetDirection(&MidPoint1);
				i2ndElbowDir	=	MidPoint1.GetDirection(&MidPoint2);
				MidPoint2.SetZ(m_pPointE->Z());
				i3rdElbowDir	=	MidPoint2.GetDirection(m_pPointE);

				for (i=LAYER_METAL1;i<=iNumLayer;++i)
				{
					if(pDesign->GetLayer(i)->GetDirection()==i1stElbowDir)
					{				
						for (j=LAYER_METAL1;j<=iNumLayer;++j)
						{
							if(pDesign->GetLayer(j)->GetDirection()==i2ndElbowDir)
							{
								for (k=LAYER_METAL1;k<=iNumLayer;k++)
								{
									if(pDesign->GetLayer(k)->GetDirection()==i3rdElbowDir)
									{
										AddSegmentList(Bend(&MidPoint1,&MidPoint2,i,j,k));	
									}
								}
							}
						}
					}
				}
			}
		}
	}
}